

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FieldDescriptor::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this)

{
  bool bVar1;
  Descriptor *this_00;
  string *value;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  int local_20;
  undefined1 local_19;
  int depth;
  FieldDescriptor *this_local;
  string *contents;
  
  local_19 = 0;
  _depth = this;
  this_local = (FieldDescriptor *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_20 = 0;
  bVar1 = is_extension(this);
  if (bVar1) {
    this_00 = containing_type(this);
    value = Descriptor::full_name_abi_cxx11_(this_00);
    strings::internal::SubstituteArg::SubstituteArg(&local_60,value);
    strings::internal::SubstituteArg::SubstituteArg(&local_90);
    strings::internal::SubstituteArg::SubstituteArg(&local_c0);
    strings::internal::SubstituteArg::SubstituteArg(&local_f0);
    strings::internal::SubstituteArg::SubstituteArg(&local_120);
    strings::internal::SubstituteArg::SubstituteArg(&local_150);
    strings::internal::SubstituteArg::SubstituteArg(&local_180);
    strings::internal::SubstituteArg::SubstituteArg(&local_1b0);
    strings::internal::SubstituteArg::SubstituteArg(&local_1e0);
    strings::internal::SubstituteArg::SubstituteArg(&local_210);
    strings::SubstituteAndAppend
              (__return_storage_ptr__,"extend .$0 {\n",&local_60,&local_90,&local_c0,&local_f0,
               &local_120,&local_150,&local_180,&local_1b0,&local_1e0,&local_210);
    local_20 = 1;
  }
  DebugString(this,local_20,__return_storage_ptr__);
  bVar1 = is_extension(this);
  if (bVar1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string FieldDescriptor::DebugString() const {
  string contents;
  int depth = 0;
  if (is_extension()) {
    strings::SubstituteAndAppend(&contents, "extend .$0 {\n",
                                 containing_type()->full_name());
    depth = 1;
  }
  DebugString(depth, &contents);
  if (is_extension()) {
     contents.append("}\n");
  }
  return contents;
}